

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TUDPTransportTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::testutils::TUDPTransport_testUDPTransport_Test::TestBody
          (TUDPTransport_testUDPTransport_Test *this)

{
  string *this_00;
  undefined8 *puVar1;
  uint32_t in_ECX;
  int *val1;
  int __fd;
  char *pcVar2;
  thread clientThread;
  int local_2a0 [2];
  AssertHelper local_298 [12];
  uint32_t numRead;
  AssertionResult gtest_ar_;
  string message;
  array<unsigned_char,_256UL> buffer;
  TUDPTransport server;
  
  std::__cxx11::string::string((string *)&message,"test",(allocator *)&server);
  std::__cxx11::string::string((string *)&gtest_ar_,"127.0.0.1",(allocator *)&clientThread);
  net::IPAddress::v4((IPAddress *)&buffer,(string *)&gtest_ar_,0);
  TUDPTransport::TUDPTransport(&server,(IPAddress *)&buffer);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = server._socket._handle >= 0;
  if (server._socket._handle < 0) {
    testing::Message::Message((Message *)&clientThread);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&buffer,&gtest_ar_.success_,"server.isOpen()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/testutils/TUDPTransportTest.cpp"
               ,0x2c,(char *)buffer._M_elems._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2a0,(Message *)&clientThread);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a0);
    std::__cxx11::string::~string((string *)&buffer);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&clientThread);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    memcpy(&buffer,&server._serverAddr,0x84);
    this_00 = (string *)(buffer._M_elems + 0x88);
    std::__cxx11::string::string(this_00,(string *)&message);
    clientThread._M_id._M_thread = (id)0;
    puVar1 = (undefined8 *)operator_new(0xb0);
    *puVar1 = &PTR___State_impl_002224e0;
    memcpy(puVar1 + 1,&buffer,0x88);
    std::__cxx11::string::string((string *)(puVar1 + 0x12),this_00);
    gtest_ar_._0_8_ = puVar1;
    std::thread::_M_start_thread(&clientThread,&gtest_ar_,0);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
    std::__cxx11::string::~string(this_00);
    numRead = apache::thrift::transport::readAll<jaegertracing::testutils::TUDPTransport>
                        ((transport *)&server,(TUDPTransport *)&buffer,
                         (uint8_t *)(ulong)(uint)message._M_string_length,in_ECX);
    val1 = local_2a0;
    local_2a0[0] = 0;
    testing::internal::CmpHelperLT<int,unsigned_int>
              ((internal *)&gtest_ar_,"0","numRead",val1,&numRead);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)local_2a0);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_298,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/testutils/TUDPTransportTest.cpp"
                 ,0x47,pcVar2);
      testing::internal::AssertHelper::operator=(local_298,(Message *)local_2a0);
      testing::internal::AssertHelper::~AssertHelper(local_298);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_2a0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      __fd = (int)&buffer;
      TUDPTransport::write(&server,__fd,(void *)(ulong)numRead,(size_t)val1);
      std::thread::join();
      net::Socket::close(&server._socket,__fd);
    }
    std::thread::~thread(&clientThread);
  }
  TUDPTransport::~TUDPTransport(&server);
  std::__cxx11::string::~string((string *)&message);
  return;
}

Assistant:

TEST(TUDPTransport, testUDPTransport)
{
    const std::string message("test");

    TUDPTransport server(net::IPAddress::v4("127.0.0.1", 0));
    server.open();  // Not necessary. Just making sure this is called.
    ASSERT_TRUE(server.isOpen());

    const auto serverAddr = server.addr();
    std::thread clientThread([serverAddr, message]() {
        net::Socket connUDP;
        connUDP.open(AF_INET, SOCK_DGRAM);
        const auto numWritten =
            ::sendto(connUDP.handle(),
                     message.c_str(),
                     message.size(),
                     0,
                     reinterpret_cast<const ::sockaddr*>(&serverAddr.addr()),
                     serverAddr.addrLen());
        ASSERT_EQ(numWritten, message.size());

        std::array<char, kBufferSize> buffer;
        const auto numRead = ::recvfrom(
            connUDP.handle(), &buffer[0], buffer.size(), 0, nullptr, 0);
        const std::string received(&buffer[0], &buffer[numRead]);
        ASSERT_EQ(message.size(), numRead);
        ASSERT_EQ(message, received);

        connUDP.close();
    });

    std::array<uint8_t, kBufferSize> buffer;
    const auto numRead = server.readAll(&buffer[0], message.size());
    ASSERT_LT(0, numRead);
    server.write(&buffer[0], numRead);

    clientThread.join();
    server.close();
}